

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
LabelObjectState<true>::Float(LabelObjectState<true> *this,Context<true> *ctx,float v)

{
  int iVar1;
  stringstream *psVar2;
  ostream *poVar3;
  long in_RSI;
  BaseState<true> *in_RDI;
  float in_XMM0_Da;
  Context<true> *unaff_retaddr;
  BaseState<true> *local_8;
  
  iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Label");
  local_8 = in_RDI;
  if (iVar1 == 0) {
    *(float *)(*(long *)(in_RSI + 0x50) + 0x6828) = in_XMM0_Da;
    *(undefined1 *)&in_RDI[2].name = 1;
  }
  else {
    iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Initial");
    if (iVar1 == 0) {
      *(float *)(*(long *)(in_RSI + 0x50) + 0x6830) = in_XMM0_Da;
      *(undefined1 *)&in_RDI[2].name = 1;
    }
    else {
      iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Weight");
      if (iVar1 == 0) {
        *(float *)(*(long *)(in_RSI + 0x50) + 0x682c) = in_XMM0_Da;
        *(undefined1 *)&in_RDI[2].name = 1;
      }
      else {
        iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Action");
        if (iVar1 == 0) {
          *(int *)((long)&in_RDI[1].name + 4) = (int)(long)in_XMM0_Da;
          *(undefined1 *)((long)&in_RDI[2].name + 1) = 1;
        }
        else {
          iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Cost");
          if (iVar1 == 0) {
            *(float *)&in_RDI[1].name = in_XMM0_Da;
            *(undefined1 *)((long)&in_RDI[2].name + 1) = 1;
          }
          else {
            iVar1 = strcasecmp(*(char **)(in_RSI + 0x10),"Probability");
            if (iVar1 == 0) {
              *(float *)&in_RDI[2]._vptr_BaseState = in_XMM0_Da;
              *(undefined1 *)((long)&in_RDI[2].name + 1) = 1;
            }
            else {
              psVar2 = Context<true>::error_abi_cxx11_(unaff_retaddr);
              poVar3 = std::operator<<((ostream *)(psVar2 + 0x10),"Unsupported label property: \'");
              poVar3 = std::operator<<(poVar3,*(char **)(in_RSI + 0x10));
              poVar3 = std::operator<<(poVar3,"\' len: ");
              std::ostream::operator<<(poVar3,*(uint *)(in_RSI + 0x18));
              local_8 = (BaseState<true> *)0x0;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // simple
    if (!_stricmp(ctx.key, "Label"))
    {
      ctx.ex->l.simple.label = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Initial"))
    {
      ctx.ex->l.simple.initial = v;
      found = true;
    }
    else if (!_stricmp(ctx.key, "Weight"))
    {
      ctx.ex->l.simple.weight = v;
      found = true;
    }
    // CB
    else if (!_stricmp(ctx.key, "Action"))
    {
      cb_label.action = (uint32_t)v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Cost"))
    {
      cb_label.cost = v;
      found_cb = true;
    }
    else if (!_stricmp(ctx.key, "Probability"))
    {
      cb_label.probability = v;
      found_cb = true;
    }
    else
    {
      ctx.error() << "Unsupported label property: '" << ctx.key << "' len: " << ctx.key_length;
      return nullptr;
    }

    return this;
  }